

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Deserializer::ReadVariableData(ByteData *__return_storage_ptr__,Deserializer *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ReadVariableBuffer(&local_28,this);
  ByteData::ByteData(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Deserializer::ReadVariableData() {
  return ByteData(ReadVariableBuffer());
}